

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O0

int __thiscall amrex::Amr::numGrids(Amr *this)

{
  int iVar1;
  size_type in_RDI;
  int i;
  int cnt;
  int iVar2;
  int iVar3;
  
  iVar3 = 0;
  for (iVar2 = 0; iVar2 <= *(int *)(in_RDI + 0x94); iVar2 = iVar2 + 1) {
    Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                  *)CONCAT44(iVar3,iVar2),in_RDI);
    std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
              ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)0x10e390f);
    iVar1 = AmrLevel::numGrids((AmrLevel *)0x10e3917);
    iVar3 = iVar1 + iVar3;
  }
  return iVar3;
}

Assistant:

int
Amr::numGrids () noexcept
{
    int cnt = 0;
    for (int i = 0; i <= finest_level; i++) {
        cnt += amr_level[i]->numGrids();
    }
    return cnt;
}